

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::ContainsKey(BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *this,NumberTrio *key)

{
  undefined4 uVar1;
  Type piVar2;
  Type pSVar3;
  undefined4 uVar4;
  ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio> *pIVar5;
  hash_t hVar6;
  uint depth;
  Type this_00;
  uint uVar7;
  
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 != (Type)0x0) {
    hVar6 = PrimePolicy::ModPrime
                      (key->y * 0x400 + key->x * 0x100000 + key->z & 0x7fffffff,this->bucketCount,
                       this->modFunctionIndex);
    uVar7 = piVar2[hVar6];
    depth = 0;
    if (-1 < (int)uVar7) {
      pSVar3 = this->entries;
      depth = 0;
      do {
        pIVar5 = &pSVar3[uVar7].
                  super_DefaultHashedEntry<Js::NumberTrio,_Js::NumberTrio,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                  .super_ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio>;
        uVar1 = (pIVar5->
                super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
                ).super_ValueEntryData<Js::NumberTrio>.value.x;
        uVar4 = (pIVar5->
                super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
                ).super_ValueEntryData<Js::NumberTrio>.value.y;
        if (((key->x == uVar1) && (key->y == uVar4)) &&
           (key->z == pSVar3[uVar7].
                      super_DefaultHashedEntry<Js::NumberTrio,_Js::NumberTrio,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                      .super_ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio>.
                      super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
                      .super_ValueEntryData<Js::NumberTrio>.value.z)) {
          this_00 = this->stats;
          goto LAB_00360a73;
        }
        depth = depth + 1;
        uVar7 = pSVar3[uVar7].
                super_DefaultHashedEntry<Js::NumberTrio,_Js::NumberTrio,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .super_ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio>.
                super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
                .super_ValueEntryData<Js::NumberTrio>.next;
      } while (-1 < (int)uVar7);
    }
  }
  this_00 = this->stats;
  uVar7 = 0xffffffff;
LAB_00360a73:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  return -1 < (int)uVar7;
}

Assistant:

bool ContainsKey(const TKey& key) const
        {
            return FindEntry(key) >= 0;
        }